

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.h
# Opt level: O3

bool __thiscall CNetMsg_Sv_ServerSettings::Pack(CNetMsg_Sv_ServerSettings *this,CMsgPacker *pPacker)

{
  CPacker::AddInt(&pPacker->super_CPacker,this->m_KickVote);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_KickMin);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_SpecVote);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_TeamLock);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_TeamBalance);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_PlayerSlots);
  return (pPacker->super_CPacker).m_Error != 0;
}

Assistant:

bool Pack(CMsgPacker *pPacker)
	{
		pPacker->AddInt(m_KickVote);
		pPacker->AddInt(m_KickMin);
		pPacker->AddInt(m_SpecVote);
		pPacker->AddInt(m_TeamLock);
		pPacker->AddInt(m_TeamBalance);
		pPacker->AddInt(m_PlayerSlots);
		return pPacker->Error() != 0;
	}